

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-circular-array.cc
# Opt level: O0

void __thiscall CircularArrayTest_size_Test::TestBody(CircularArrayTest_size_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_148;
  Message local_140;
  size_type local_138;
  undefined4 local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_4;
  Message local_110;
  size_type local_108;
  uint local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_3;
  Message local_e0;
  size_type local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_a8;
  Message local_a0;
  size_type local_98;
  uint local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_68;
  Message local_60;
  size_type local_58;
  undefined4 local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  CircularArray<(anonymous_namespace)::TestObject,_2UL> ca;
  CircularArrayTest_size_Test *this_local;
  
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_);
  local_4c = 0;
  local_58 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::size
                       ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_)
  ;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_48,"0U",(uint *)"ca.size()",(unsigned_long *)&local_4c,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
               ,0xda,pcVar2);
    testing::internal::AssertHelper::operator=(&local_68,&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(&local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (bVar1) {
    anon_unknown.dwarf_f66d::TestObject::TestObject((TestObject *)&gtest_ar_1.message_,1,0);
    wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
              ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_,
               (value_type *)&gtest_ar_1.message_);
    anon_unknown.dwarf_f66d::TestObject::~TestObject((TestObject *)&gtest_ar_1.message_);
    local_8c = 1;
    local_98 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::size
                         ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                          &gtest_ar.message_);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
              ((EqHelper<false> *)local_88,"1U","ca.size()",&local_8c,&local_98);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
    if (!bVar1) {
      testing::Message::Message(&local_a0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                 ,0xdd,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      testing::Message::~Message(&local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
    if (bVar1) {
      anon_unknown.dwarf_f66d::TestObject::TestObject
                ((TestObject *)((long)&gtest_ar_2.message_.ptr_ + 4),2,0);
      wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::push_back
                ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_,
                 (value_type *)((long)&gtest_ar_2.message_.ptr_ + 4));
      anon_unknown.dwarf_f66d::TestObject::~TestObject
                ((TestObject *)((long)&gtest_ar_2.message_.ptr_ + 4));
      local_cc = 2;
      local_d8 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::size
                           ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                            &gtest_ar.message_);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_c8,"2U","ca.size()",&local_cc,&local_d8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                   ,0xe0,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_e0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
      if (bVar1) {
        wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back
                  ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_);
        local_fc = 1;
        local_108 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::size
                              ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                               &gtest_ar.message_);
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                  ((EqHelper<false> *)local_f8,"1U","ca.size()",&local_fc,&local_108);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_110);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                     ,0xe3,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_110);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_110);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
        if (bVar1) {
          wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::pop_back
                    ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_);
          local_12c = 0;
          local_138 = wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::size
                                ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)
                                 &gtest_ar.message_);
          testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
                    (local_128,"0U",(uint *)"ca.size()",(unsigned_long *)&local_12c,&local_138);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
          if (!bVar1) {
            testing::Message::Message(&local_140);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
            testing::internal::AssertHelper::AssertHelper
                      (&local_148,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-circular-array.cc"
                       ,0xe6,pcVar2);
            testing::internal::AssertHelper::operator=(&local_148,&local_140);
            testing::internal::AssertHelper::~AssertHelper(&local_148);
            testing::Message::~Message(&local_140);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        }
      }
    }
  }
  wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
            ((CircularArray<(anonymous_namespace)::TestObject,_2UL> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(CircularArrayTest, size) {
  CircularArray<TestObject, 2> ca;

  ASSERT_EQ(0U, ca.size());

  ca.push_back(TestObject(1));
  ASSERT_EQ(1U, ca.size());

  ca.push_back(TestObject(2));
  ASSERT_EQ(2U, ca.size());

  ca.pop_back();
  ASSERT_EQ(1U, ca.size());

  ca.pop_back();
  ASSERT_EQ(0U, ca.size());
}